

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O1

void Abc_TgImplementPerm(Abc_TgMan_t *pMan,char *pPermDest)

{
  char cVar1;
  word *pTruth;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar4 = pMan->nVars;
  uVar6 = (ulong)uVar4;
  uVar5 = 1 << ((byte)uVar4 & 0x1f) & pMan->uPhase;
  if (0 < (int)uVar4) {
    uVar2 = 0;
    do {
      pMan->pPermTRev[pMan->pPermT[uVar2]] = (char)uVar2;
      uVar2 = uVar2 + 1;
    } while (uVar6 != uVar2);
  }
  if (0 < (int)uVar4) {
    uVar2 = 0;
    do {
      pMan->pPermT[uVar2] = pMan->pPermTRev[pPermDest[uVar2]];
      uVar2 = uVar2 + 1;
    } while (uVar6 != uVar2);
  }
  if (0 < (int)uVar4) {
    uVar2 = 0;
    do {
      pMan->pPermTRev[pMan->pPermT[uVar2]] = (char)uVar2;
      uVar2 = uVar2 + 1;
    } while (uVar6 != uVar2);
  }
  if (0 < (int)uVar4) {
    pTruth = pMan->pTruth;
    uVar3 = 0;
    uVar2 = uVar3;
    do {
      while (uVar2 != (uint)(int)pMan->pPermTRev[uVar3]) {
        uVar3 = uVar3 + 1;
        if (uVar6 == uVar3) {
          __assert_fail("k < nVars",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                        ,0x787,"void Abc_TtImplementNpnConfig(word *, int, char *, unsigned int)");
        }
      }
      if (uVar2 != (uVar3 & 0xffffffff)) {
        Abc_TtSwapVars(pTruth,uVar4,(int)uVar2,(int)uVar3);
        cVar1 = pMan->pPermTRev[uVar2];
        pMan->pPermTRev[uVar2] = pMan->pPermTRev[uVar3];
        pMan->pPermTRev[uVar3] = cVar1;
      }
      uVar3 = uVar2 + 1;
      uVar2 = uVar3;
    } while (uVar3 != uVar6);
  }
  if (0 < (int)uVar4) {
    uVar2 = 0;
    do {
      uVar4 = 1 << ((byte)uVar2 & 0x1f);
      if ((pMan->uPhase >> ((byte)pMan->pPermT[uVar2] & 0x1f) & 1) == 0) {
        uVar4 = 0;
      }
      uVar5 = uVar5 | uVar4;
      cVar1 = pPermDest[uVar2];
      pMan->pPermT[uVar2] = cVar1;
      pMan->pPermTRev[cVar1] = (byte)uVar2;
      uVar2 = uVar2 + 1;
    } while (uVar6 != uVar2);
  }
  pMan->uPhase = uVar5;
  return;
}

Assistant:

static void Abc_TgImplementPerm(Abc_TgMan_t* pMan, const char *pPermDest)
{
    int i, nVars = pMan->nVars;
    char *pPerm = pMan->pPermT;
    char *pRev = pMan->pPermTRev;
    unsigned uPhase = pMan->uPhase & (1 << nVars);

    for (i = 0; i < nVars; i++)
        pRev[(int)pPerm[i]] = i;
    for (i = 0; i < nVars; i++)
        pPerm[i] = pRev[(int)pPermDest[i]];
    for (i = 0; i < nVars; i++)
        pRev[(int)pPerm[i]] = i;

    Abc_TtImplementNpnConfig(pMan->pTruth, nVars, pRev, 0);
//  Abc_TtVerifySmallTruth(pMan->pTruth, nVars);

    for (i = 0; i < nVars; i++)
    {
        if (pMan->uPhase & (1 << pPerm[i]))
            uPhase |= (1 << i);
        pPerm[i] = pPermDest[i];
        pRev[(int)pPerm[i]] = i;
    }
    pMan->uPhase = uPhase;
}